

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

filtration_entry_t __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  pair<float,_int> *ppVar1;
  _Elt_pointer pfVar2;
  pair<float,_int> pVar3;
  filtration_entry_t *pfVar4;
  ulong uVar5;
  pair<float,_int> local_30;
  
  remove_trivial_coefficient_entries(this);
  ppVar1 = &((this->
             super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur)->super_pair<float,_int>;
  pVar3 = dummy.super_pair<float,_int>;
  if (&((this->
        super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int> != ppVar1) {
    pVar3 = *ppVar1;
    safe_pop(this);
    uVar5 = (ulong)pVar3 >> 0x20;
    pfVar4 = (filtration_entry_t *)&local_30;
    while( true ) {
      pfVar2 = (this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((this->
           super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur == pfVar2) ||
         ((pfVar2->super_pair<float,_int>).second != (int)uVar5)) goto LAB_0014d2f4;
      safe_pop(this);
      remove_trivial_coefficient_entries(this);
      pfVar2 = (this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->
          super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur == pfVar2) break;
      pVar3.second = 0;
      pVar3.first = (pfVar2->super_pair<float,_int>).first;
      uVar5 = (ulong)(uint)(pfVar2->super_pair<float,_int>).second;
      safe_pop(this);
    }
    pfVar4 = &dummy;
LAB_0014d2f4:
    local_30.second = (int)uVar5;
    local_30.first = pVar3.first;
    pVar3 = pfVar4->super_pair<float,_int>;
  }
  return (filtration_entry_t)pVar3;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return dummy;
		else {
			auto pivot = get_top();

#ifdef USE_COEFFICIENTS
			coefficient_t coefficient = 0;
			do {
				coefficient = (coefficient + get_coefficient(get_top())) % modulus;
				safe_pop();
				remove_trivial_coefficient_entries();

				if (coefficient == 0) {
					if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
						return dummy;
					else
						pivot = get_top();
				}
			} while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			         get_index(get_top()) == get_index(pivot));
			if (get_index(pivot) != -1) { set_coefficient(pivot, coefficient); }
#else
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return dummy;
				else {
					pivot = get_top();
					safe_pop();
				}
			}
#endif
			return pivot;
		}
	}